

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O3

void calc0<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options2 *opt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  invalid_argument *this;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RCX;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  r_2;
  real_t Jy;
  real_t Jx;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  f;
  multiply_immediates local_4a9;
  cpp_dec_float<100U,_int,_void> local_4a8;
  cpp_dec_float<100U,_int,_void> local_458;
  expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_408;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_2b8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_268;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_218;
  square local_1c8 [8];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  undefined8 uStack_190;
  int local_188;
  undefined1 local_184;
  fpclass_type local_180;
  int32_t iStack_17c;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_d8;
  tc local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_308.fpclass = cpp_dec_float_finite;
  local_308.prec_elem = 0x10;
  local_308.data._M_elems[0] = 0;
  local_308.data._M_elems[1] = 0;
  local_308.data._M_elems[2] = 0;
  local_308.data._M_elems[3] = 0;
  local_308.data._M_elems[4] = 0;
  local_308.data._M_elems[5] = 0;
  local_308.data._M_elems[6] = 0;
  local_308.data._M_elems[7] = 0;
  local_308.data._M_elems[8] = 0;
  local_308.data._M_elems[9] = 0;
  local_308.data._M_elems[10] = 0;
  local_308.data._M_elems[0xb] = 0;
  local_308.data._M_elems[0xc] = 0;
  local_308.data._M_elems[0xd] = 0;
  local_308.data._M_elems._56_5_ = 0;
  local_308.data._M_elems[0xf]._1_3_ = 0;
  local_308.exp = 0;
  local_308.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_308,(opt->Jx)._M_dataplus._M_p);
  local_358.fpclass = cpp_dec_float_finite;
  local_358.prec_elem = 0x10;
  local_358.data._M_elems[0] = 0;
  local_358.data._M_elems[1] = 0;
  local_358.data._M_elems[2] = 0;
  local_358.data._M_elems[3] = 0;
  local_358.data._M_elems[4] = 0;
  local_358.data._M_elems[5] = 0;
  local_358.data._M_elems[6] = 0;
  local_358.data._M_elems[7] = 0;
  local_358.data._M_elems[8] = 0;
  local_358.data._M_elems[9] = 0;
  local_358.data._M_elems[10] = 0;
  local_358.data._M_elems[0xb] = 0;
  local_358.data._M_elems[0xc] = 0;
  local_358.data._M_elems[0xd] = 0;
  local_358.data._M_elems._56_5_ = 0;
  local_358.data._M_elems[0xf]._1_3_ = 0;
  local_358.exp = 0;
  local_358.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_358,(opt->Jy)._M_dataplus._M_p);
  local_458.exp = 0;
  local_458.neg = false;
  local_458.data._M_elems[0xc] = 0;
  local_458.data._M_elems[0xd] = 0;
  local_458.data._M_elems._56_5_ = 0;
  local_458.data._M_elems[0xf]._1_3_ = 0;
  local_458.data._M_elems[8] = 0;
  local_458.data._M_elems[9] = 0;
  local_458.data._M_elems[10] = 0;
  local_458.data._M_elems[0xb] = 0;
  local_458.data._M_elems[4] = 0;
  local_458.data._M_elems[5] = 0;
  local_458.data._M_elems[6] = 0;
  local_458.data._M_elems[7] = 0;
  local_458.data._M_elems[0] = 0;
  local_458.data._M_elems[1] = 0;
  local_458.data._M_elems[2] = 0;
  local_458.data._M_elems[3] = 0;
  local_3f8.exp = 0;
  local_3f8.neg = false;
  local_3f8.data._M_elems[0xc] = 0;
  local_3f8.data._M_elems[0xd] = 0;
  local_3f8.data._M_elems._56_5_ = 0;
  local_3f8.data._M_elems[0xf]._1_3_ = 0;
  local_3f8.data._M_elems[8] = 0;
  local_3f8.data._M_elems[9] = 0;
  local_3f8.data._M_elems[10] = 0;
  local_3f8.data._M_elems[0xb] = 0;
  local_3f8.data._M_elems[4] = 0;
  local_3f8.data._M_elems[5] = 0;
  local_3f8.data._M_elems[6] = 0;
  local_3f8.data._M_elems[7] = 0;
  local_3f8.data._M_elems[0] = 0;
  local_3f8.data._M_elems[1] = 0;
  local_3f8.data._M_elems[2] = 0;
  local_3f8.data._M_elems[3] = 0;
  local_3a8.exp = 0;
  local_3a8.neg = false;
  local_3a8.data._M_elems[0xc] = 0;
  local_3a8.data._M_elems[0xd] = 0;
  local_3a8.data._M_elems._56_5_ = 0;
  local_3a8.data._M_elems[0xf]._1_3_ = 0;
  local_3a8.data._M_elems[8] = 0;
  local_3a8.data._M_elems[9] = 0;
  local_3a8.data._M_elems[10] = 0;
  local_3a8.data._M_elems[0xb] = 0;
  local_3a8.data._M_elems[4] = 0;
  local_3a8.data._M_elems[5] = 0;
  local_3a8.data._M_elems[6] = 0;
  local_3a8.data._M_elems[7] = 0;
  local_3a8.data._M_elems[0] = 0;
  local_3a8.data._M_elems[1] = 0;
  local_3a8.data._M_elems[2] = 0;
  local_3a8.data._M_elems[3] = 0;
  iVar3 = std::__cxx11::string::compare((char *)&opt->Tmin);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&opt->Tmin), iVar3 == 0)) {
    uStack_50 = CONCAT35(local_308.data._M_elems[0xf]._1_3_,local_308.data._M_elems._56_5_);
    local_88 = (tc  [8])local_308.data._M_elems._0_8_;
    auStack_80[0] = local_308.data._M_elems[2];
    auStack_80[1] = local_308.data._M_elems[3];
    local_78[0] = local_308.data._M_elems[4];
    local_78[1] = local_308.data._M_elems[5];
    auStack_70[0] = local_308.data._M_elems[6];
    auStack_70[1] = local_308.data._M_elems[7];
    local_68[0] = local_308.data._M_elems[8];
    local_68[1] = local_308.data._M_elems[9];
    auStack_60[0] = local_308.data._M_elems[10];
    auStack_60[1] = local_308.data._M_elems[0xb];
    local_58[0] = local_308.data._M_elems[0xc];
    local_58[1] = local_308.data._M_elems[0xd];
    local_48 = local_308.exp;
    local_44 = local_308.neg;
    local_40 = local_308.fpclass;
    iStack_3c = local_308.prec_elem;
    local_d8.base.m_backend.data._M_elems[0xf]._1_3_ = local_358.data._M_elems[0xf]._1_3_;
    local_d8.base.m_backend.data._M_elems._56_5_ = local_358.data._M_elems._56_5_;
    local_d8.base.m_backend.data._M_elems[0] = local_358.data._M_elems[0];
    local_d8.base.m_backend.data._M_elems[1] = local_358.data._M_elems[1];
    local_d8.base.m_backend.data._M_elems[2] = local_358.data._M_elems[2];
    local_d8.base.m_backend.data._M_elems[3] = local_358.data._M_elems[3];
    local_d8.base.m_backend.data._M_elems[4] = local_358.data._M_elems[4];
    local_d8.base.m_backend.data._M_elems[5] = local_358.data._M_elems[5];
    local_d8.base.m_backend.data._M_elems[6] = local_358.data._M_elems[6];
    local_d8.base.m_backend.data._M_elems[7] = local_358.data._M_elems[7];
    local_d8.base.m_backend.data._M_elems[8] = local_358.data._M_elems[8];
    local_d8.base.m_backend.data._M_elems[9] = local_358.data._M_elems[9];
    local_d8.base.m_backend.data._M_elems[10] = local_358.data._M_elems[10];
    local_d8.base.m_backend.data._M_elems[0xb] = local_358.data._M_elems[0xb];
    local_d8.base.m_backend.data._M_elems[0xc] = local_358.data._M_elems[0xc];
    local_d8.base.m_backend.data._M_elems[0xd] = local_358.data._M_elems[0xd];
    local_d8.base.m_backend.exp = local_358.exp;
    local_d8.base.m_backend.neg = local_358.neg;
    local_d8.base.m_backend.fpclass = local_358.fpclass;
    local_d8.base.m_backend.prec_elem = local_358.prec_elem;
    ising::tc::
    square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_4a8,local_88,&local_d8,in_RCX);
    local_3f8.data._M_elems[0] = local_4a8.data._M_elems[0];
    local_3f8.data._M_elems[1] = local_4a8.data._M_elems[1];
    local_3f8.data._M_elems[2] = local_4a8.data._M_elems[2];
    local_3f8.data._M_elems[3] = local_4a8.data._M_elems[3];
    local_3f8.data._M_elems[4] = local_4a8.data._M_elems[4];
    local_3f8.data._M_elems[5] = local_4a8.data._M_elems[5];
    local_3f8.data._M_elems[6] = local_4a8.data._M_elems[6];
    local_3f8.data._M_elems[7] = local_4a8.data._M_elems[7];
    local_3f8.data._M_elems[8] = local_4a8.data._M_elems[8];
    local_3f8.data._M_elems[9] = local_4a8.data._M_elems[9];
    local_3f8.data._M_elems[10] = local_4a8.data._M_elems[10];
    local_3f8.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
    local_3f8.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
    local_3f8.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
    local_3f8.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
    local_3f8.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
    local_3f8.exp = local_4a8.exp;
    local_3f8.neg = local_4a8.neg;
    local_3f8.fpclass = local_4a8.fpclass;
    local_3f8.prec_elem = local_4a8.prec_elem;
    local_458.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
    local_458.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
    local_458.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
    local_458.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
    local_458.data._M_elems[8] = local_4a8.data._M_elems[8];
    local_458.data._M_elems[9] = local_4a8.data._M_elems[9];
    local_458.data._M_elems[10] = local_4a8.data._M_elems[10];
    local_458.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
    local_458.data._M_elems[4] = local_4a8.data._M_elems[4];
    local_458.data._M_elems[5] = local_4a8.data._M_elems[5];
    local_458.data._M_elems[6] = local_4a8.data._M_elems[6];
    local_458.data._M_elems[7] = local_4a8.data._M_elems[7];
    local_458.data._M_elems[0] = local_4a8.data._M_elems[0];
    local_458.data._M_elems[1] = local_4a8.data._M_elems[1];
    local_458.data._M_elems[2] = local_4a8.data._M_elems[2];
    local_458.data._M_elems[3] = local_4a8.data._M_elems[3];
    local_458.exp = local_4a8.exp;
    local_458.neg = local_4a8.neg;
    local_458.fpclass = local_4a8.fpclass;
    local_458.prec_elem = local_4a8.prec_elem;
  }
  else {
    local_4a8.fpclass = cpp_dec_float_finite;
    local_4a8.prec_elem = 0x10;
    local_4a8.data._M_elems[0] = 0;
    local_4a8.data._M_elems[1] = 0;
    local_4a8.data._M_elems[2] = 0;
    local_4a8.data._M_elems[3] = 0;
    local_4a8.data._M_elems[4] = 0;
    local_4a8.data._M_elems[5] = 0;
    local_4a8.data._M_elems[6] = 0;
    local_4a8.data._M_elems[7] = 0;
    local_4a8.data._M_elems[8] = 0;
    local_4a8.data._M_elems[9] = 0;
    local_4a8.data._M_elems[10] = 0;
    local_4a8.data._M_elems[0xb] = 0;
    local_4a8.data._M_elems[0xc] = 0;
    local_4a8.data._M_elems[0xd] = 0;
    local_4a8.data._M_elems._56_5_ = 0;
    local_4a8.data._M_elems[0xf]._1_3_ = 0;
    local_4a8.exp = 0;
    local_4a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
              (&local_4a8,(opt->Tmin)._M_dataplus._M_p);
    local_458.data._M_elems[0] = local_4a8.data._M_elems[0];
    local_458.data._M_elems[1] = local_4a8.data._M_elems[1];
    local_458.data._M_elems[2] = local_4a8.data._M_elems[2];
    local_458.data._M_elems[3] = local_4a8.data._M_elems[3];
    local_458.data._M_elems[4] = local_4a8.data._M_elems[4];
    local_458.data._M_elems[5] = local_4a8.data._M_elems[5];
    local_458.data._M_elems[6] = local_4a8.data._M_elems[6];
    local_458.data._M_elems[7] = local_4a8.data._M_elems[7];
    local_458.data._M_elems[8] = local_4a8.data._M_elems[8];
    local_458.data._M_elems[9] = local_4a8.data._M_elems[9];
    local_458.data._M_elems[10] = local_4a8.data._M_elems[10];
    local_458.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
    local_458.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
    local_458.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
    local_458.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
    local_458.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
    local_458.exp = local_4a8.exp;
    local_458.neg = local_4a8.neg;
    local_458.fpclass = local_4a8.fpclass;
    local_458.prec_elem = local_4a8.prec_elem;
    local_4a8.fpclass = cpp_dec_float_finite;
    local_4a8.prec_elem = 0x10;
    local_4a8.data._M_elems[0] = 0;
    local_4a8.data._M_elems[1] = 0;
    local_4a8.data._M_elems[2] = 0;
    local_4a8.data._M_elems[3] = 0;
    local_4a8.data._M_elems[4] = 0;
    local_4a8.data._M_elems[5] = 0;
    local_4a8.data._M_elems[6] = 0;
    local_4a8.data._M_elems[7] = 0;
    local_4a8.data._M_elems[8] = 0;
    local_4a8.data._M_elems[9] = 0;
    local_4a8.data._M_elems[10] = 0;
    local_4a8.data._M_elems[0xb] = 0;
    local_4a8.data._M_elems[0xc] = 0;
    local_4a8.data._M_elems[0xd] = 0;
    local_4a8.data._M_elems._56_5_ = 0;
    local_4a8.data._M_elems[0xf]._1_3_ = 0;
    local_4a8.exp = 0;
    local_4a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
              (&local_4a8,(opt->Tmax)._M_dataplus._M_p);
    local_3f8.data._M_elems[0] = local_4a8.data._M_elems[0];
    local_3f8.data._M_elems[1] = local_4a8.data._M_elems[1];
    local_3f8.data._M_elems[2] = local_4a8.data._M_elems[2];
    local_3f8.data._M_elems[3] = local_4a8.data._M_elems[3];
    local_3f8.data._M_elems[4] = local_4a8.data._M_elems[4];
    local_3f8.data._M_elems[5] = local_4a8.data._M_elems[5];
    local_3f8.data._M_elems[6] = local_4a8.data._M_elems[6];
    local_3f8.data._M_elems[7] = local_4a8.data._M_elems[7];
    local_3f8.data._M_elems[8] = local_4a8.data._M_elems[8];
    local_3f8.data._M_elems[9] = local_4a8.data._M_elems[9];
    local_3f8.data._M_elems[10] = local_4a8.data._M_elems[10];
    local_3f8.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
    local_3f8.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
    local_3f8.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
    local_3f8.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
    local_3f8.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
    local_3f8.exp = local_4a8.exp;
    local_3f8.neg = local_4a8.neg;
    local_3f8.fpclass = local_4a8.fpclass;
    local_3f8.prec_elem = local_4a8.prec_elem;
    local_4a8.fpclass = cpp_dec_float_finite;
    local_4a8.prec_elem = 0x10;
    local_4a8.data._M_elems[0] = 0;
    local_4a8.data._M_elems[1] = 0;
    local_4a8.data._M_elems[2] = 0;
    local_4a8.data._M_elems[3] = 0;
    local_4a8.data._M_elems[4] = 0;
    local_4a8.data._M_elems[5] = 0;
    local_4a8.data._M_elems[6] = 0;
    local_4a8.data._M_elems[7] = 0;
    local_4a8.data._M_elems[8] = 0;
    local_4a8.data._M_elems[9] = 0;
    local_4a8.data._M_elems[10] = 0;
    local_4a8.data._M_elems[0xb] = 0;
    local_4a8.data._M_elems[0xc] = 0;
    local_4a8.data._M_elems[0xd] = 0;
    local_4a8.data._M_elems._56_5_ = 0;
    local_4a8.data._M_elems[0xf]._1_3_ = 0;
    local_4a8.exp = 0;
    local_4a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
              (&local_4a8,(opt->dT)._M_dataplus._M_p);
  }
  local_3a8.data._M_elems._0_8_ = local_4a8.data._M_elems._0_8_;
  local_4a8.data._M_elems._0_8_ = local_4a8.data._M_elems._0_8_ & 0xffffffff00000000;
  local_3a8.data._M_elems._8_8_ = local_4a8.data._M_elems._8_8_;
  local_3a8.data._M_elems._16_8_ = local_4a8.data._M_elems._16_8_;
  local_3a8.data._M_elems._24_8_ = local_4a8.data._M_elems._24_8_;
  local_3a8.data._M_elems._32_8_ = local_4a8.data._M_elems._32_8_;
  local_3a8.data._M_elems._40_8_ = local_4a8.data._M_elems._40_8_;
  local_3a8.data._M_elems._48_8_ = local_4a8.data._M_elems._48_8_;
  local_3a8.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
  local_3a8.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
  local_3a8.exp = local_4a8.exp;
  local_3a8.neg = local_4a8.neg;
  local_3a8._72_8_ = local_4a8._72_8_;
  bVar2 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&local_458,(int *)&local_4a8);
  if (!bVar2) {
    local_128.data._M_elems._0_8_ = local_128.data._M_elems._0_8_ & 0xffffffff00000000;
    bVar2 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_3f8,(int *)&local_128);
    if (!bVar2) {
      if (((local_458.fpclass == cpp_dec_float_NaN) || (local_3f8.fpclass == cpp_dec_float_NaN)) ||
         (iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_458,&local_3f8), iVar3 < 1)) {
        local_4a8.data._M_elems._0_8_ = local_4a8.data._M_elems._0_8_ & 0xffffffff00000000;
        bVar2 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                            *)&local_3a8,(int *)&local_4a8);
        lVar1 = std::cout;
        if (!bVar2) {
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
               0x100;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) =
               100;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# lattice: square\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# precision: ",0xd);
          plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,100);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n",0x20);
          local_128.data._M_elems[0xf]._1_3_ = local_458.data._M_elems[0xf]._1_3_;
          local_128.data._M_elems._56_5_ = local_458.data._M_elems._56_5_;
          local_128.data._M_elems[0xc] = local_458.data._M_elems[0xc];
          local_128.data._M_elems[0xd] = local_458.data._M_elems[0xd];
          local_128.data._M_elems[8] = local_458.data._M_elems[8];
          local_128.data._M_elems[9] = local_458.data._M_elems[9];
          local_128.data._M_elems[10] = local_458.data._M_elems[10];
          local_128.data._M_elems[0xb] = local_458.data._M_elems[0xb];
          local_128.data._M_elems[4] = local_458.data._M_elems[4];
          local_128.data._M_elems[5] = local_458.data._M_elems[5];
          local_128.data._M_elems[6] = local_458.data._M_elems[6];
          local_128.data._M_elems[7] = local_458.data._M_elems[7];
          local_128.data._M_elems[0] = local_458.data._M_elems[0];
          local_128.data._M_elems[1] = local_458.data._M_elems[1];
          local_128.data._M_elems[2] = local_458.data._M_elems[2];
          local_128.data._M_elems[3] = local_458.data._M_elems[3];
          local_128.exp = local_458.exp;
          local_128.neg = local_458.neg;
          local_128.fpclass = local_458.fpclass;
          local_128.prec_elem = local_458.prec_elem;
          while( true ) {
            local_408.arg2 = (type)&local_3a8;
            local_408.arg1 = (type)0x3f1a36e2eb1c432d;
            local_4a8.fpclass = cpp_dec_float_finite;
            local_4a8.prec_elem = 0x10;
            local_4a8.data._M_elems[0] = 0;
            local_4a8.data._M_elems[1] = 0;
            local_4a8.data._M_elems[2] = 0;
            local_4a8.data._M_elems[3] = 0;
            local_4a8.data._M_elems[4] = 0;
            local_4a8.data._M_elems[5] = 0;
            local_4a8.data._M_elems[6] = 0;
            local_4a8.data._M_elems[7] = 0;
            local_4a8.data._M_elems[8] = 0;
            local_4a8.data._M_elems[9] = 0;
            local_4a8.data._M_elems[10] = 0;
            local_4a8.data._M_elems[0xb] = 0;
            local_4a8.data._M_elems[0xc] = 0;
            local_4a8.data._M_elems[0xd] = 0;
            local_4a8.data._M_elems._56_5_ = 0;
            local_4a8.data._M_elems[0xf]._1_3_ = 0;
            local_4a8.exp = 0;
            local_4a8.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,double,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_4a8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_double,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)&local_408,&local_4a9);
            local_2b8.m_backend.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
            local_2b8.m_backend.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
            local_408.arg2 = &local_2b8;
            local_2b8.m_backend.data._M_elems[0] = local_4a8.data._M_elems[0];
            local_2b8.m_backend.data._M_elems[1] = local_4a8.data._M_elems[1];
            local_2b8.m_backend.data._M_elems[2] = local_4a8.data._M_elems[2];
            local_2b8.m_backend.data._M_elems[3] = local_4a8.data._M_elems[3];
            local_2b8.m_backend.data._M_elems[4] = local_4a8.data._M_elems[4];
            local_2b8.m_backend.data._M_elems[5] = local_4a8.data._M_elems[5];
            local_2b8.m_backend.data._M_elems[6] = local_4a8.data._M_elems[6];
            local_2b8.m_backend.data._M_elems[7] = local_4a8.data._M_elems[7];
            local_2b8.m_backend.data._M_elems[8] = local_4a8.data._M_elems[8];
            local_2b8.m_backend.data._M_elems[9] = local_4a8.data._M_elems[9];
            local_2b8.m_backend.data._M_elems[10] = local_4a8.data._M_elems[10];
            local_2b8.m_backend.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
            local_2b8.m_backend.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
            local_2b8.m_backend.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
            local_2b8.m_backend.exp = local_4a8.exp;
            local_2b8.m_backend.neg = local_4a8.neg;
            local_2b8.m_backend.fpclass = local_4a8.fpclass;
            local_2b8.m_backend.prec_elem = local_4a8.prec_elem;
            local_408.arg1 = (type)&local_3f8;
            local_4a8.fpclass = cpp_dec_float_finite;
            local_4a8.prec_elem = 0x10;
            local_4a8.data._M_elems[0] = 0;
            local_4a8.data._M_elems[1] = 0;
            local_4a8.data._M_elems[2] = 0;
            local_4a8.data._M_elems[3] = 0;
            local_4a8.data._M_elems[4] = 0;
            local_4a8.data._M_elems[5] = 0;
            local_4a8.data._M_elems[6] = 0;
            local_4a8.data._M_elems[7] = 0;
            local_4a8.data._M_elems[8] = 0;
            local_4a8.data._M_elems[9] = 0;
            local_4a8.data._M_elems[10] = 0;
            local_4a8.data._M_elems[0xb] = 0;
            local_4a8.data._M_elems[0xc] = 0;
            local_4a8.data._M_elems[0xd] = 0;
            local_4a8.data._M_elems._56_5_ = 0;
            local_4a8.data._M_elems[0xf]._1_3_ = 0;
            local_4a8.exp = 0;
            local_4a8.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_4a8,&local_408,(add_immediates *)&local_4a9);
            local_178.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
            local_178.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
            local_178.data._M_elems[0] = local_4a8.data._M_elems[0];
            local_178.data._M_elems[1] = local_4a8.data._M_elems[1];
            local_178.data._M_elems[2] = local_4a8.data._M_elems[2];
            local_178.data._M_elems[3] = local_4a8.data._M_elems[3];
            local_178.data._M_elems[4] = local_4a8.data._M_elems[4];
            local_178.data._M_elems[5] = local_4a8.data._M_elems[5];
            local_178.data._M_elems[6] = local_4a8.data._M_elems[6];
            local_178.data._M_elems[7] = local_4a8.data._M_elems[7];
            local_178.data._M_elems[8] = local_4a8.data._M_elems[8];
            local_178.data._M_elems[9] = local_4a8.data._M_elems[9];
            local_178.data._M_elems[10] = local_4a8.data._M_elems[10];
            local_178.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
            local_178.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
            local_178.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
            local_178.exp = local_4a8.exp;
            local_178.neg = local_4a8.neg;
            local_178.fpclass = local_4a8.fpclass;
            local_178.prec_elem = local_4a8.prec_elem;
            if ((local_128.fpclass == cpp_dec_float_NaN) || (local_4a8.fpclass == cpp_dec_float_NaN)
               ) break;
            iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_128,&local_178);
            if (-1 < iVar3) {
              return;
            }
            operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_4a8,1,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_128);
            uStack_190 = CONCAT35(local_308.data._M_elems[0xf]._1_3_,local_308.data._M_elems._56_5_)
            ;
            local_1c8 = (square  [8])local_308.data._M_elems._0_8_;
            auStack_1c0[0] = local_308.data._M_elems[2];
            auStack_1c0[1] = local_308.data._M_elems[3];
            local_1b8[0] = local_308.data._M_elems[4];
            local_1b8[1] = local_308.data._M_elems[5];
            auStack_1b0[0] = local_308.data._M_elems[6];
            auStack_1b0[1] = local_308.data._M_elems[7];
            local_1a8[0] = local_308.data._M_elems[8];
            local_1a8[1] = local_308.data._M_elems[9];
            auStack_1a0[0] = local_308.data._M_elems[10];
            auStack_1a0[1] = local_308.data._M_elems[0xb];
            local_198[0] = local_308.data._M_elems[0xc];
            local_198[1] = local_308.data._M_elems[0xd];
            local_188 = local_308.exp;
            local_184 = local_308.neg;
            local_180 = local_308.fpclass;
            iStack_17c = local_308.prec_elem;
            local_218.base.m_backend.data._M_elems[0xf]._1_3_ = local_358.data._M_elems[0xf]._1_3_;
            local_218.base.m_backend.data._M_elems._56_5_ = local_358.data._M_elems._56_5_;
            local_218.base.m_backend.data._M_elems[0] = local_358.data._M_elems[0];
            local_218.base.m_backend.data._M_elems[1] = local_358.data._M_elems[1];
            local_218.base.m_backend.data._M_elems[2] = local_358.data._M_elems[2];
            local_218.base.m_backend.data._M_elems[3] = local_358.data._M_elems[3];
            local_218.base.m_backend.data._M_elems[4] = local_358.data._M_elems[4];
            local_218.base.m_backend.data._M_elems[5] = local_358.data._M_elems[5];
            local_218.base.m_backend.data._M_elems[6] = local_358.data._M_elems[6];
            local_218.base.m_backend.data._M_elems[7] = local_358.data._M_elems[7];
            local_218.base.m_backend.data._M_elems[8] = local_358.data._M_elems[8];
            local_218.base.m_backend.data._M_elems[9] = local_358.data._M_elems[9];
            local_218.base.m_backend.data._M_elems[10] = local_358.data._M_elems[10];
            local_218.base.m_backend.data._M_elems[0xb] = local_358.data._M_elems[0xb];
            local_218.base.m_backend.data._M_elems[0xc] = local_358.data._M_elems[0xc];
            local_218.base.m_backend.data._M_elems[0xd] = local_358.data._M_elems[0xd];
            local_218.base.m_backend.exp = local_358.exp;
            local_218.base.m_backend.neg = local_358.neg;
            local_218.base.m_backend.fpclass = local_358.fpclass;
            local_218.base.m_backend.prec_elem = local_358.prec_elem;
            local_268.base.m_backend.data._M_elems[0xf]._1_3_ = local_4a8.data._M_elems[0xf]._1_3_;
            local_268.base.m_backend.data._M_elems._56_5_ = local_4a8.data._M_elems._56_5_;
            local_268.base.m_backend.data._M_elems[0] = local_4a8.data._M_elems[0];
            local_268.base.m_backend.data._M_elems[1] = local_4a8.data._M_elems[1];
            local_268.base.m_backend.data._M_elems[2] = local_4a8.data._M_elems[2];
            local_268.base.m_backend.data._M_elems[3] = local_4a8.data._M_elems[3];
            local_268.base.m_backend.data._M_elems[4] = local_4a8.data._M_elems[4];
            local_268.base.m_backend.data._M_elems[5] = local_4a8.data._M_elems[5];
            local_268.base.m_backend.data._M_elems[6] = local_4a8.data._M_elems[6];
            local_268.base.m_backend.data._M_elems[7] = local_4a8.data._M_elems[7];
            local_268.base.m_backend.data._M_elems[8] = local_4a8.data._M_elems[8];
            local_268.base.m_backend.data._M_elems[9] = local_4a8.data._M_elems[9];
            local_268.base.m_backend.data._M_elems[10] = local_4a8.data._M_elems[10];
            local_268.base.m_backend.data._M_elems[0xb] = local_4a8.data._M_elems[0xb];
            local_268.base.m_backend.data._M_elems[0xc] = local_4a8.data._M_elems[0xc];
            local_268.base.m_backend.data._M_elems[0xd] = local_4a8.data._M_elems[0xd];
            local_268.base.m_backend.exp = local_4a8.exp;
            local_268.base.m_backend.neg = local_4a8.neg;
            local_268.base.m_backend.fpclass = local_4a8.fpclass;
            local_268.base.m_backend.prec_elem = local_4a8.prec_elem;
            ising::free_energy::square::
            infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&local_178,local_1c8,&local_218,&local_268,in_R8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inf inf ",8);
            poVar5 = boost::multiprecision::operator<<
                               ((ostream *)&std::cout,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                 *)&local_308);
            local_2b8.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2b8,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_358);
            local_2b8.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2b8,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_128);
            local_2b8.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2b8,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_4a8);
            local_2b8.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2b8,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_178);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," N/A N/A",8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_128,&local_3a8);
          }
          return;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"dT should be positive");
      }
      else {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
      }
      goto LAB_0012ab0f;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Temperature should be positive");
LAB_0012ab0f:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc0(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t beta = 1 / t;
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << beta << ' '
              << f << " N/A N/A" << std::endl;
  }
}